

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O1

Maybe<kj::HttpHeaders::Response> * __thiscall
kj::HttpHeaders::tryParseResponse
          (Maybe<kj::HttpHeaders::Response> *__return_storage_ptr__,HttpHeaders *this,
          ArrayPtr<char> content)

{
  long lVar1;
  bool bVar2;
  byte *pbVar3;
  uint uVar4;
  ulong uVar5;
  byte *pbVar6;
  ulong uVar7;
  byte bVar8;
  char *pcVar9;
  byte *end;
  StringPtr SVar10;
  char *ptr;
  byte *local_58;
  char *local_50;
  char local_48 [8];
  int *local_40;
  ulong local_38;
  
  uVar5 = content.size_;
  local_58 = (byte *)content.ptr;
  uVar7 = 0;
  if ((uVar5 < 2) || (local_58[uVar5 - 1] != 10)) {
    end = (byte *)0x0;
  }
  else {
    lVar1 = uVar5 - 1;
    if (local_58[uVar5 - 2] == 0xd) {
      lVar1 = uVar5 - 2;
    }
    end = local_58 + lVar1;
    local_58[~(ulong)(local_58[uVar5 - 2] == 0xd) + uVar5] = 0;
  }
  if (end != (byte *)0x0) {
    pcVar9 = local_48;
    consumeWord((char **)&local_58);
    if (((local_48[0] == '\x01') && (5 < local_38)) &&
       (pbVar3 = local_58, (char)local_40[1] == '/' && *local_40 == 0x50545448)) {
      for (; (*pbVar3 == 9 || (*pbVar3 == 0x20)); pbVar3 = pbVar3 + 1) {
      }
      uVar4 = 0;
      pbVar6 = pbVar3;
      do {
        bVar8 = *pbVar6 - 0x30;
        if (bVar8 < 10) {
          uVar4 = ((uint)*pbVar6 + uVar4 * 10) - 0x30;
          pbVar6 = pbVar6 + 1;
        }
        else if (pbVar3 == pbVar6) {
          uVar7 = 0;
        }
        else {
          uVar7 = 1;
          pcVar9 = (char *)(ulong)uVar4;
          local_58 = pbVar6;
        }
      } while (bVar8 < 10);
      if ((uVar7 & 1) != 0) {
        SVar10 = consumeLine((char **)&local_58);
        local_50 = SVar10.content.ptr;
        bVar2 = parseHeaders(this,(char *)local_58,(char *)end);
        if (bVar2) {
          (__return_storage_ptr__->ptr).isSet = true;
          (__return_storage_ptr__->ptr).field_1.value.statusCode = (uint)pcVar9;
          (__return_storage_ptr__->ptr).field_1.value.statusText.content.ptr = local_50;
          (__return_storage_ptr__->ptr).field_1.value.statusText.content.size_ =
               SVar10.content.size_;
          return __return_storage_ptr__;
        }
      }
    }
  }
  (__return_storage_ptr__->ptr).isSet = false;
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<HttpHeaders::Response> HttpHeaders::tryParseResponse(kj::ArrayPtr<char> content) {
  char* end = trimHeaderEnding(content);
  if (end == nullptr) return nullptr;

  char* ptr = content.begin();

  HttpHeaders::Response response;

  KJ_IF_MAYBE(version, consumeWord(ptr)) {
    if (!version->startsWith("HTTP/")) return nullptr;
  } else {
    return nullptr;
  }

  KJ_IF_MAYBE(code, consumeNumber(ptr)) {
    response.statusCode = *code;
  } else {
    return nullptr;
  }

  response.statusText = consumeLine(ptr);

  if (!parseHeaders(ptr, end)) return nullptr;

  return response;
}